

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test::
~TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test
          (TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test
           *this)

{
  TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test
  *this_local;
  
  ~TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test(this)
  ;
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterFailsWhenNotHavingACopierRepository)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCopyCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}